

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdExtractEcdsaAdaptorSecret
              (void *handle,char *adaptor_signature,char *signature,char *adaptor,
              char **adaptor_secret)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  Privkey secret;
  string local_d8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  string local_70;
  string local_50;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(adaptor_signature);
  if (bVar1) {
    secret.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    secret.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x13d;
    secret.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdExtractEcdsaAdaptorSecret";
    cfd::core::logger::warn<>((CfdSourceLocation *)&secret,"adaptor_signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&secret,"Failed to parameter. adaptor_signature is null or empty.",
               (allocator *)&local_d8);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&secret);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    secret.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    secret.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x143;
    secret.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdExtractEcdsaAdaptorSecret";
    cfd::core::logger::warn<>((CfdSourceLocation *)&secret,"signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&secret,"Failed to parameter. signature is null or empty.",
               (allocator *)&local_d8);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&secret);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(adaptor);
  if (bVar1) {
    secret.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    secret.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x149;
    secret.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdExtractEcdsaAdaptorSecret";
    cfd::core::logger::warn<>((CfdSourceLocation *)&secret,"adaptor is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&secret,"Failed to parameter. adaptor is null or empty.",
               (allocator *)&local_d8);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&secret);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (adaptor_secret != (char **)0x0) {
    std::__cxx11::string::string((string *)&local_d8,adaptor_signature,&local_f9);
    cfd::core::AdaptorSignature::AdaptorSignature((AdaptorSignature *)&local_88,&local_d8);
    std::__cxx11::string::string((string *)&local_50,signature,&local_fa);
    cfd::core::ByteData::ByteData((ByteData *)&local_a0,&local_50);
    std::__cxx11::string::string((string *)&local_70,adaptor,&local_fb);
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_b8,&local_70);
    cfd::core::AdaptorUtil::ExtractSecret
              (&secret,(AdaptorSignature *)&local_88,(ByteData *)&local_a0,(Pubkey *)&local_b8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b8);
    std::__cxx11::string::~string((string *)&local_70);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
    std::__cxx11::string::~string((string *)&local_50);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
    std::__cxx11::string::~string((string *)&local_d8);
    cfd::core::Privkey::GetHex_abi_cxx11_(&local_d8,&secret);
    pcVar2 = cfd::capi::CreateString(&local_d8);
    *adaptor_secret = pcVar2;
    std::__cxx11::string::~string((string *)&local_d8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&secret);
    return 0;
  }
  secret.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  secret.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x14f;
  secret.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdExtractEcdsaAdaptorSecret";
  cfd::core::logger::warn<>((CfdSourceLocation *)&secret,"adaptor_secret is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&secret,"Failed to parameter. adaptor_secret is null.",(allocator *)&local_d8
            );
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&secret);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdExtractEcdsaAdaptorSecret(
    void* handle, const char* adaptor_signature, const char* signature,
    const char* adaptor, char** adaptor_secret) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(adaptor_signature)) {
      warn(CFD_LOG_SOURCE, "adaptor_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_signature is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (IsEmptyString(adaptor)) {
      warn(CFD_LOG_SOURCE, "adaptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor is null or empty.");
    }
    if (adaptor_secret == nullptr) {
      warn(CFD_LOG_SOURCE, "adaptor_secret is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_secret is null.");
    }

    Privkey secret = AdaptorUtil::ExtractSecret(
        AdaptorSignature(adaptor_signature), ByteData(signature),
        Pubkey(adaptor));

    *adaptor_secret = CreateString(secret.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}